

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_NodeSimulateSim(Ivy_FraigMan_t *p,Ivy_FraigSim_t *pSims)

{
  Ivy_FraigSim_t *pIVar1;
  Ivy_FraigSim_t *pIVar2;
  int local_34;
  int i;
  uint *pData1;
  uint *pData0;
  uint *pData;
  Ivy_FraigSim_t *pSims_local;
  Ivy_FraigMan_t *p_local;
  
  pIVar1 = pSims->pFanin0;
  pIVar2 = pSims->pFanin1;
  switch(pSims->Type) {
  case 0:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] = (&pIVar1[1].Type)[local_34] & (&pIVar2[1].Type)[local_34];
    }
    break;
  case 1:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] =
           (&pIVar1[1].Type)[local_34] & (&pIVar2[1].Type)[local_34] ^ 0xffffffff;
    }
    break;
  case 2:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] =
           (&pIVar1[1].Type)[local_34] & ((&pIVar2[1].Type)[local_34] ^ 0xffffffffU);
    }
    break;
  case 3:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] =
           (&pIVar1[1].Type)[local_34] ^ 0xffffffffU | (&pIVar2[1].Type)[local_34];
    }
    break;
  case 4:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] =
           ((&pIVar1[1].Type)[local_34] ^ 0xffffffffU) & (&pIVar2[1].Type)[local_34];
    }
    break;
  case 5:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] =
           (&pIVar1[1].Type)[local_34] | (&pIVar2[1].Type)[local_34] ^ 0xffffffffU;
    }
    break;
  case 6:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] =
           ((&pIVar1[1].Type)[local_34] | (&pIVar2[1].Type)[local_34]) ^ 0xffffffff;
    }
    break;
  case 7:
    for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
      (&pSims[1].Type)[local_34] = (&pIVar1[1].Type)[local_34] | (&pIVar2[1].Type)[local_34];
    }
  }
  return;
}

Assistant:

void Ivy_NodeSimulateSim( Ivy_FraigMan_t * p, Ivy_FraigSim_t * pSims )
{
    unsigned * pData, * pData0, * pData1;
    int i;
    pData  = pSims->pData;
    pData0 = pSims->pFanin0->pData;
    pData1 = pSims->pFanin1->pData;
    switch( pSims->Type )
    {
    case 0:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] & pData1[i]);
        break;
    case 1:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = ~(pData0[i] & pData1[i]);
        break;
    case 2:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] & ~pData1[i]);
        break;
    case 3:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (~pData0[i] | pData1[i]);
        break;
    case 4:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (~pData0[i] & pData1[i]);
        break;
    case 5:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] | ~pData1[i]);
        break;
    case 6:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = ~(pData0[i] | pData1[i]);
        break;
    case 7:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] | pData1[i]);
        break;
    }
}